

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetTargetPropertyCommand::InitialPass
          (cmGetTargetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  pointer pbVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  cmTarget *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  PolicyID id;
  MessageType t;
  string sStack_1f8;
  string var;
  string prop;
  ostringstream e;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&var);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  std::__cxx11::string::string((string *)&var,(string *)pbVar1);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  prop._M_string_length = 0;
  name = pbVar1 + 1;
  prop.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(pbVar1 + 2,"ALIASED_TARGET");
  pcVar2 = (this->super_cmCommand).Makefile;
  if (bVar3) {
    bVar3 = cmMakefile::IsAlias(pcVar2,name);
    if ((bVar3) &&
       (pcVar5 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false),
       pcVar5 != (cmTarget *)0x0)) {
      std::__cxx11::string::_M_assign((string *)&prop);
LAB_0031c376:
      bVar3 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&var,prop._M_dataplus._M_p);
      goto LAB_0031c499;
    }
  }
  else {
    pcVar5 = cmMakefile::FindTargetToUse(pcVar2,name,false);
    if (pcVar5 != (cmTarget *)0x0) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pbVar1[2]._M_string_length == 0) ||
         (pcVar6 = cmTarget::GetProperty(pcVar5,pbVar1 + 2,(this->super_cmCommand).Makefile),
         pcVar6 == (char *)0x0)) goto LAB_0031c461;
      std::__cxx11::string::assign((char *)&prop);
      goto LAB_0031c376;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0045);
    if (PVar4 - NEW < 3) {
      t = FATAL_ERROR;
      bVar3 = true;
LAB_0031c3f3:
      poVar7 = std::operator<<((ostream *)&e,
                               "get_target_property() called with non-existent target \"");
      poVar7 = std::operator<<(poVar7,(string *)name);
      std::operator<<(poVar7,"\".");
      pcVar2 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,t,&sStack_1f8);
      std::__cxx11::string::~string((string *)&sStack_1f8);
      if (bVar3) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        bVar3 = false;
        goto LAB_0031c499;
      }
    }
    else if (PVar4 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1f8,(cmPolicies *)0x2d,id);
      poVar7 = std::operator<<((ostream *)&e,(string *)&sStack_1f8);
      std::operator<<(poVar7,"\n");
      std::__cxx11::string::~string((string *)&sStack_1f8);
      bVar3 = false;
      t = AUTHOR_WARNING;
      goto LAB_0031c3f3;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
LAB_0031c461:
  pcVar2 = (this->super_cmCommand).Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,&var,
                 "-NOTFOUND");
  cmMakefile::AddDefinition(pcVar2,&var,_e);
  std::__cxx11::string::~string((string *)&e);
  bVar3 = true;
LAB_0031c499:
  std::__cxx11::string::~string((string *)&prop);
  std::__cxx11::string::~string((string *)&var);
  return bVar3;
}

Assistant:

bool cmGetTargetPropertyCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() != 3 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string var = args[0];
  const std::string& targetName = args[1];
  std::string prop;
  bool prop_exists = false;

  if(args[2] == "ALIASED_TARGET")
    {
    if(this->Makefile->IsAlias(targetName))
      {
      if(cmTarget* target =
                          this->Makefile->FindTargetToUse(targetName))
        {
        prop = target->GetName();
        prop_exists = true;
        }
      }
    }
  else if(cmTarget* tgt = this->Makefile->FindTargetToUse(targetName))
    {
    cmTarget& target = *tgt;
    const char* prop_cstr = 0;
    if (!args[2].empty())
      {
      prop_cstr = target.GetProperty(args[2], this->Makefile);
      }
    if(prop_cstr)
      {
      prop = prop_cstr;
      prop_exists = true;
      }
    }
  else
    {
    bool issueMessage = false;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0045))
      {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
      }
    if (issueMessage)
      {
      e << "get_target_property() called with non-existent target \""
        << targetName <<  "\".";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    }
  if (prop_exists)
    {
    this->Makefile->AddDefinition(var, prop.c_str());
    return true;
    }
  this->Makefile->AddDefinition(var, (var+"-NOTFOUND").c_str());
  return true;
}